

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O1

int TextStartsWithWhitespace(Lexer *lexer,Node *node,uint start,uint mode)

{
  uint uVar1;
  Bool BVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (node == (Node *)0x0) {
    __assert_fail("node != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/pprint.c"
                  ,0x71c,"int TextStartsWithWhitespace(Lexer *, Node *, uint, uint)");
  }
  if (((mode & 0x12) != 0) &&
     ((BVar2 = prvTidynodeIsText(node), BVar2 != no || ((node->type - AspTag & 0xfffffffd) == 0))))
  {
    uVar1 = node->end;
    if (node->start <= start && node->start < uVar1) {
      uVar5 = (ulong)start;
      if (start < uVar1) {
        uVar4 = (ulong)start;
        do {
          uVar5 = uVar4;
          if ((0x20 < (ulong)(byte)lexer->lexbuf[uVar4]) ||
             ((0x100002200U >> ((ulong)(byte)lexer->lexbuf[uVar4] & 0x3f) & 1) == 0)) break;
          uVar4 = uVar4 + 1;
          uVar5 = (ulong)uVar1;
        } while (uVar1 != uVar4);
      }
      iVar3 = (uint)uVar5 - start;
      if (start <= (uint)uVar5 && iVar3 != 0) {
        return iVar3;
      }
    }
  }
  return -1;
}

Assistant:

static int TextStartsWithWhitespace( Lexer *lexer, Node *node, uint start, uint mode )
{
    assert( node != NULL );
    if ( (mode & (CDATA|COMMENT)) && TY_(nodeIsTextLike)(node) && node->end > node->start && start >= node->start )
    {
        uint ch, ix = start;
        /* Skip whitespace. */
        while ( ix < node->end && (ch = (lexer->lexbuf[ix] & 0xff))
                && ( ch==' ' || ch=='\t' || ch=='\r' ) )
            ++ix;

        if ( ix > start )
          return ix - start;
    }
    return -1;
}